

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * google::protobuf::internal::InlineGreedyStringParser(string *s,char *ptr,ParseContext *ctx)

{
  uint32 size_00;
  int size;
  ParseContext *ctx_local;
  char *ptr_local;
  string *s_local;
  
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)s;
  size_00 = ReadSize((char **)&ctx_local);
  if (ctx_local == (ParseContext *)0x0) {
    s_local = (string *)0x0;
  }
  else {
    s_local = (string *)
              EpsCopyInputStream::ReadString
                        (&ctx->super_EpsCopyInputStream,(char *)ctx_local,size_00,
                         (string *)ptr_local);
  }
  return (char *)s_local;
}

Assistant:

const char* InlineGreedyStringParser(std::string* s, const char* ptr,
                                     ParseContext* ctx) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  return ctx->ReadString(ptr, size, s);
}